

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O1

bool VulkanUtilities::anon_unknown_1::IsExtensionAvailable
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
               char *ExtensionName)

{
  pointer pVVar1;
  int iVar2;
  char (*in_RCX) [25];
  pointer __s1;
  bool bVar3;
  string msg;
  string local_40;
  
  if (ExtensionName == (char *)0x0) {
    Diligent::FormatString<char[26],char[25]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ExtensionName != nullptr",in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"IsExtensionAvailable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x91);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  __s1 = (Extensions->
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pVVar1 = (Extensions->
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = __s1 != pVVar1;
  if (bVar3) {
    iVar2 = strcmp(__s1->extensionName,ExtensionName);
    while (iVar2 != 0) {
      __s1 = __s1 + 1;
      bVar3 = __s1 != pVVar1;
      if (__s1 == pVVar1) {
        return bVar3;
      }
      iVar2 = strcmp(__s1->extensionName,ExtensionName);
    }
  }
  return bVar3;
}

Assistant:

bool IsExtensionAvailable(const std::vector<VkExtensionProperties>& Extensions, const char* ExtensionName)
{
    VERIFY_EXPR(ExtensionName != nullptr);

    for (const auto& Extension : Extensions)
    {
        if (strcmp(Extension.extensionName, ExtensionName) == 0)
            return true;
    }

    return false;
}